

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O2

char * set_mname(MonsterThing *tp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  
  bVar1 = see_monst(tp);
  if (((uint)player.flags >> 0xe & 1) == 0 && !bVar1) {
    pcVar5 = "something";
    if (terse != false) {
      pcVar5 = "it";
    }
  }
  else {
    if (((uint)player.flags >> 0xb & 1) == 0) {
      lVar4 = (long)tp->type + -0x41;
    }
    else {
      iVar2 = getMapDisplay((tp->pos).x,(tp->pos).y);
      iVar3 = isupper(iVar2);
      if (iVar3 == 0) {
        iVar2 = rnd(0x1a);
      }
      else {
        iVar2 = iVar2 + -0x41;
      }
      lVar4 = (long)iVar2;
    }
    strcpy(set_mname::tbuf + 4,monsters[lVar4].m_name);
    pcVar5 = set_mname::tbuf;
  }
  return pcVar5;
}

Assistant:

const char* set_mname(MonsterThing *tp)
{
    int ch;
    const char *mname;
    static char tbuf[MAXSTR] = { 't', 'h', 'e', ' ' };

    if (!see_monst(tp) && !on(player, SEEMONST))
        return (terse ? "it" : "something");
    else if (on(player, ISHALU))
    {
        ch = getMapDisplay(tp->pos.x, tp->pos.y);
        if (!isupper(ch))
            ch = rnd(26);
        else
            ch -= 'A';
        mname = monsters[ch].m_name;
    }
    else
        mname = monsters[tp->type - 'A'].m_name;
    strcpy(&tbuf[4], mname);
    return tbuf;
}